

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds-load.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  _List_node_base *p_Var2;
  QueuePolicy *q_policy;
  int iVar3;
  string_view format_str;
  format_args args;
  bool help;
  _List_node_base *local_1840;
  _List_node_base *local_1838;
  _List_node_base *local_1830;
  _Any_data local_1828;
  code *local_1818;
  code *local_1810;
  int nvals;
  int tot_blocks;
  communicator world;
  ContiguousAssigner read_assigner;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17d8;
  DestroyBlock local_17c8;
  CreateBlock local_17a8;
  string local_1780;
  environment env;
  _Any_data local_1758;
  code *local_1748;
  undefined8 uStack_1740;
  _Any_data local_1738;
  code *local_1728;
  undefined8 uStack_1720;
  string local_1718;
  string local_16f8;
  Options ops;
  communicator local_16a0;
  LoadBlock local_1688;
  Master read_master;
  
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       CONCAT44(ops.args.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next._4_4_,argc);
  read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&ops,&read_master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  tot_blocks = world.size_;
  nvals = 100;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&ops;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&read_master,"tot_blocks","");
  local_1828._M_unused._M_object = &local_1818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1828," total number of blocks","");
  opts::Option<int>((opts *)&local_1830,'b',(string *)&read_master,&tot_blocks,(string *)&local_1828
                   );
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = local_1830;
  local_1830 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner = (_func_int **)&local_17d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&read_assigner,"nvals","");
  local_1780._M_dataplus._M_p = (pointer)&local_1780.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1780," number of values per block","");
  opts::Option<int>((opts *)&local_1838,'n',(string *)&read_assigner,&nvals,&local_1780);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = local_1838;
  local_1838 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_16f8._M_dataplus._M_p = (pointer)&local_16f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16f8,"help","");
  local_1718._M_dataplus._M_p = (pointer)&local_1718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1718," show help","");
  opts::Option<bool>((opts *)&local_1840,'h',&local_16f8,&help,&local_1718);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = local_1840;
  local_1840 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1840 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1840 + 8))();
  }
  local_1840 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_dataplus._M_p != &local_1718.field_2) {
    operator_delete(local_1718._M_dataplus._M_p,local_1718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
    operator_delete(local_16f8._M_dataplus._M_p,local_16f8.field_2._M_allocated_capacity + 1);
  }
  if (local_1838 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1838 + 8))();
  }
  local_1838 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1780._M_dataplus._M_p != &local_1780.field_2) {
    operator_delete(local_1780._M_dataplus._M_p,local_1780.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner != &local_17d8) {
    operator_delete(read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner,
                    local_17d8._M_allocated_capacity + 1);
  }
  if (local_1830 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1830 + 8))();
  }
  local_1830 = (_List_node_base *)0x0;
  if ((code **)local_1828._M_unused._0_8_ != &local_1818) {
    operator_delete(local_1828._M_unused._M_object,(ulong)(local_1818 + 1));
  }
  if (read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)read_master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    local_16a0.comm_.data = world.comm_.data;
    local_16a0.rank_ = world.rank_;
    local_16a0.size_ = world.size_;
    local_16a0.owner_ = false;
    local_17a8.super__Function_base._M_functor._8_8_ = 0;
    local_17a8.super__Function_base._M_functor._M_unused._M_object = Block::create;
    local_17a8._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_17a8.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_17c8.super__Function_base._M_functor._8_8_ = 0;
    local_17c8.super__Function_base._M_functor._M_unused._M_object = Block::destroy;
    local_17c8._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_17c8.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_1738._M_unused._M_object = (void *)0x0;
    local_1738._8_8_ = 0;
    local_1728 = (code *)0x0;
    uStack_1720 = 0;
    local_1758._M_unused._M_object = (void *)0x0;
    local_1758._8_8_ = 0;
    local_1748 = (code *)0x0;
    uStack_1740 = 0;
    q_policy = (QueuePolicy *)operator_new(0x10);
    q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0013f218;
    q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&read_master,&local_16a0,1,-1,&local_17a8,&local_17c8,(ExternalStorage *)0x0
                        ,(SaveBlock *)&local_1738,(LoadBlock *)&local_1758,q_policy);
    if (local_1748 != (code *)0x0) {
      (*local_1748)(&local_1758,&local_1758,__destroy_functor);
    }
    if (local_1728 != (code *)0x0) {
      (*local_1728)(&local_1738,&local_1738,__destroy_functor);
    }
    if (local_17c8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_17c8.super__Function_base._M_manager)
                ((_Any_data *)&local_17c8,(_Any_data *)&local_17c8,__destroy_functor);
    }
    if (local_17a8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_17a8.super__Function_base._M_manager)
                ((_Any_data *)&local_17a8,(_Any_data *)&local_17a8,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_16a0);
    read_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    read_assigner.super_StaticAssigner.super_Assigner.nblocks_ = -1;
    read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0013f3c0;
    local_1828._M_unused._M_object = &local_1818;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1828,"test.out","");
    local_1688.super__Function_base._M_functor._8_8_ = 0;
    local_1688.super__Function_base._M_functor._M_unused._M_object = Block::load;
    local_1688._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_1688.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    diy::io::read_blocks
              ((string *)&local_1828,&world,&read_assigner.super_StaticAssigner,&read_master,
               &local_1688);
    if (local_1688.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1688.super__Function_base._M_manager)
                ((_Any_data *)&local_1688,(_Any_data *)&local_1688,__destroy_functor);
    }
    if ((code **)local_1828._M_unused._0_8_ != &local_1818) {
      operator_delete(local_1828._M_unused._M_object,(ulong)(local_1818 + 1));
    }
    local_1828._M_unused._M_member_pointer =
         (ulong)((long)read_master.blocks_.elements_.
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)read_master.blocks_.elements_.
                      super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    format_str.size_ = 0x19;
    format_str.data_ = "{} blocks read from file\n";
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_1828;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 2;
    fmt::v7::vprint(_stderr,format_str,args);
    local_1780._M_dataplus._M_p = (pointer)Block::print_data;
    local_1780._M_string_length = 0;
    local_1828._M_unused._M_object = (code **)0x0;
    local_1828._8_8_ = 0;
    local_1810 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_1818 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&read_master,(offset_in_Block_to_subr *)&local_1780,(Skip *)&local_1828);
    if (local_1818 != (code *)0x0) {
      (*local_1818)(&local_1828,&local_1828,3);
    }
    diy::Master::~Master(&read_master);
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // read the results back
    diy::Master read_master(world,
            num_threads,
            mem_blocks,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);
}